

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_harmonic_symplectic.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  N_Vector yvec;
  undefined8 uVar6;
  double *pdVar7;
  undefined8 uVar8;
  int opt;
  int opt_00;
  int opt_01;
  int opt_02;
  int opt_03;
  int opt_04;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  double dVar12;
  double dVar13;
  longdouble lVar14;
  undefined4 local_ec;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  int local_c4;
  SUNContext sunctx;
  undefined8 local_b8;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  sunrealtype tret;
  int local_9c;
  UserData local_98;
  longdouble local_74;
  double local_68;
  double local_60;
  double *local_58;
  sunrealtype local_50;
  double local_48;
  sunrealtype local_40;
  undefined8 local_38;
  
  sunctx = (SUNContext)0x0;
  local_e8 = (double)CONCAT44(local_e8._4_4_,4);
  local_b8._0_4_ = 8;
  local_d0 = 0.0;
  local_d8 = 6.283185307179586;
  local_e0 = 0.001;
  local_c4 = 1;
  iVar4 = 1;
  while (iVar4 < argc) {
    __s1 = argv[iVar4];
    iVar2 = strcmp(__s1,"--order");
    if (iVar2 == 0) {
      iVar2 = iVar4 + 1;
      iVar4 = atoi(argv[(long)iVar4 + 1]);
      local_e8 = (double)CONCAT44(local_e8._4_4_,iVar4);
    }
    else {
      iVar2 = strcmp(__s1,"--tf");
      if (iVar2 == 0) {
        local_d8 = strtod(argv[(long)iVar4 + 1],(char **)0x0);
        iVar2 = iVar4 + 1;
      }
      else {
        iVar2 = strcmp(__s1,"--dt");
        if (iVar2 == 0) {
          local_e0 = strtod(argv[(long)iVar4 + 1],(char **)0x0);
          iVar2 = iVar4 + 1;
        }
        else {
          iVar2 = strcmp(__s1,"--nout");
          if (iVar2 == 0) {
            iVar2 = iVar4 + 1;
            local_b8._0_4_ = atoi(argv[(long)iVar4 + 1]);
          }
          else {
            iVar3 = strcmp(__s1,"--use-compensated-sums");
            iVar2 = iVar4;
            if (iVar3 == 0) {
              local_d0 = 4.94065645841247e-324;
            }
            else {
              iVar4 = strcmp(__s1,"--disable-tstop");
              local_c4 = 0;
              if (iVar4 != 0) {
                iVar4 = strcmp(__s1,"--help");
                if (iVar4 != 0) {
                  fprintf(_stderr,"ERROR: unrecognized argument %s\n",__s1);
                }
                fwrite("ark_harmonic_symplectic: an ARKODE example demonstrating the SPRKStep time-stepping module solving a simple harmonic oscillator\n"
                       ,0x80,1,_stderr);
                fprintf(_stderr,
                        "  --order <int>               the order of the method to use (default %d)\n"
                        ,4);
                fprintf(_stderr,
                        "  --dt <Real>                 the fixed-time step size to use (default %.1Le)\n"
                       );
                fprintf(_stderr,
                        "  --nout <int>                the number of output times (default %d)\n",8)
                ;
                fwrite("  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n"
                       ,0x58,1,_stderr);
                fwrite("  --disable-tstop             turns off tstop mode\n",0x33,1,_stderr);
                return 1;
              }
            }
          }
        }
      }
    }
    iVar4 = iVar2 + 1;
  }
  local_ec = SUNContext_Create(0,&sunctx);
  iVar2 = check_retval(&local_ec,"SUNContext_Create",opt);
  iVar4 = 1;
  if (iVar2 == 0) {
    puts("\n   Begin simple harmonic oscillator problem\n");
    local_98.A = 10.0;
    local_98.phi = 0.0;
    local_98.omega = 1.0;
    yvec = (N_Vector)N_VNew_Serial(2,sunctx);
    uVar6 = N_VClone(yvec);
    pdVar7 = (double *)N_VGetArrayPointer(yvec);
    *pdVar7 = 10.0;
    pdVar7[1] = -0.0;
    uVar8 = SPRKStepCreate(0,xdot,vdot,yvec,sunctx);
    iVar2 = local_e8._0_4_;
    local_38 = uVar8;
    local_ec = ARKodeSetOrder(uVar8,(ulong)local_e8 & 0xffffffff);
    iVar3 = check_retval(&local_ec,"ARKodeSetOrder",opt_00);
    if (iVar3 == 0) {
      local_ec = ARKodeSetUserData(uVar8,&local_98);
      iVar3 = check_retval(&local_ec,"ARKodeSetUserData",opt_01);
      if (iVar3 == 0) {
        local_ec = SPRKStepSetUseCompensatedSums(uVar8,local_d0);
        iVar3 = check_retval(&local_ec,"SPRKStepSetUseCompensatedSums",opt_02);
        if (iVar3 == 0) {
          local_ec = ARKodeSetFixedStep(local_e0,uVar8);
          iVar3 = check_retval(&local_ec,"ARKodeSetFixedStep",opt_03);
          if (iVar3 == 0) {
            dVar12 = ceil(local_d8 / local_e0);
            local_ec = ARKodeSetMaxNumSteps(uVar8,(long)dVar12 + 2);
            iVar5 = check_retval(&local_ec,"ARKodeSetMaxNumSteps",opt_04);
            iVar3 = (int)local_b8;
            pFVar1 = _stdout;
            if (iVar5 == 0) {
              tret = 0.0;
              local_60 = local_d8 / (double)(int)local_b8;
              local_d0 = local_60 + 0.0;
              local_74 = (longdouble)*pdVar7;
              local_58 = pdVar7;
              local_40 = Energy(yvec,0.0,&local_98);
              lVar9 = (longdouble)local_40;
              lVar10 = (longdouble)0;
              lVar14 = local_74;
              lVar11 = lVar10;
              fprintf(pFVar1,"t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.6Lf\n");
              local_68 = (double)(iVar2 + -2);
              dVar12 = local_d0;
              iVar4 = 0;
              if (0 < iVar3) {
                iVar4 = iVar3;
              }
              while (iVar2 = iVar4 + -1, iVar4 != 0) {
                local_d0 = dVar12;
                if (local_c4 != 0) {
                  ARKodeSetStopTime(uVar8);
                }
                local_9c = ARKodeEvolve(local_d0,uVar8,yvec,&tret,1,in_R8,in_R9,lVar10,lVar14,lVar9,
                                        lVar11);
                local_e8 = tret;
                pdVar7 = (double *)N_VGetArrayPointer(uVar6);
                local_b8._0_4_ = SUB84(local_98.A,0);
                local_b8._4_4_ = (undefined4)((ulong)local_98.A >> 0x20);
                dVar12 = cos(local_98.omega * local_e8 + local_98.phi);
                *pdVar7 = dVar12 * (double)CONCAT44(local_b8._4_4_,(int)local_b8);
                local_b8 = -local_98.A * local_98.omega;
                uStack_b0 = 0;
                uStack_ae = 0x800000000000;
                dVar12 = sin(local_98.omega * local_e8 + local_98.phi);
                pdVar7[1] = dVar12 * local_b8;
                N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,yvec,uVar6,uVar6);
                dVar12 = (double)N_VDotProd(uVar6,uVar6);
                if (dVar12 < 0.0) {
                  local_e8 = sqrt(dVar12);
                }
                else {
                  local_e8 = SQRT(dVar12);
                }
                pFVar1 = _stdout;
                lVar10 = (longdouble)tret;
                local_b8._0_4_ = SUB104(lVar10,0);
                local_b8._4_4_ = (undefined4)((unkuint10)lVar10 >> 0x20);
                uStack_b0 = (undefined2)((unkuint10)lVar10 >> 0x40);
                local_74 = (longdouble)*local_58;
                local_50 = Energy(yvec,local_e8,&local_98);
                lVar9 = (longdouble)local_50;
                local_48 = local_e8;
                lVar11 = (longdouble)local_e8;
                lVar10 = (longdouble)CONCAT28(uStack_b0,CONCAT44(local_b8._4_4_,(int)local_b8));
                lVar14 = local_74;
                fprintf(pFVar1,"t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.16Le\n");
                dVar12 = pow(10.0,local_68);
                dVar13 = 2.220446049250313e-13;
                if (2.220446049250313e-13 < local_e0 / dVar12) {
                  dVar13 = pow(10.0,local_68);
                  dVar13 = local_e0 / dVar13;
                }
                if (dVar13 < local_e8) {
                  fwrite("FAILURE: solution error is too high\n",0x24,1,_stderr);
                  return 1;
                }
                if (local_9c < 0) {
                  fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
                  break;
                }
                dVar12 = local_d8;
                iVar4 = iVar2;
                if (local_d0 + local_60 <= local_d8) {
                  dVar12 = local_d0 + local_60;
                }
              }
              fputc(10,_stdout);
              N_VDestroy(yvec);
              N_VDestroy(uVar6);
              iVar4 = 0;
              ARKodePrintAllStats(uVar8,_stdout,0);
              ARKodeFree(&local_38);
              SUNContext_Free(&sunctx);
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
  ProgramArgs args;
  UserData udata;
  SUNContext sunctx       = NULL;
  N_Vector y              = NULL;
  N_Vector solution       = NULL;
  sunrealtype* ydata      = NULL;
  void* arkode_mem        = NULL;
  int iout                = 0;
  int retval              = 0;
  int order               = 0;
  int use_compsums        = 0;
  int num_output_times    = 0;
  sunrealtype Tf          = SUN_RCONST(0.0);
  sunrealtype dt          = SUN_RCONST(0.0);
  sunrealtype dTout       = SUN_RCONST(0.0);
  const sunrealtype T0    = SUN_RCONST(0.0);
  const sunrealtype A     = SUN_RCONST(10.0);
  const sunrealtype phi   = SUN_RCONST(0.0);
  const sunrealtype omega = SUN_RCONST(1.0);

  /* Parse the command line arguments */
  if (ParseArgs(argc, argv, &args)) { return 1; };

  /* Default integrator options and problem parameters */
  order            = args.order;
  use_compsums     = args.use_compsums;
  num_output_times = args.num_output_times;
  Tf               = args.Tf;
  dt               = args.dt;
  dTout            = (Tf - T0) / ((sunrealtype)num_output_times);

  /* Default problem parameters */

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  printf("\n   Begin simple harmonic oscillator problem\n\n");

  /* Allocate and fill udata structure */
  udata.A     = A;
  udata.phi   = phi;
  udata.omega = omega;

  /* Allocate our state vector [x, v]^T */
  y        = N_VNew_Serial(2, sunctx);
  solution = N_VClone(y);

  /* Fill the initial conditions (x0 then v0) */
  ydata    = N_VGetArrayPointer(y);
  ydata[0] = A * cos(phi);
  ydata[1] = -A * omega * sin(phi);

  /* Create SPRKStep integrator */
  arkode_mem = SPRKStepCreate(xdot, vdot, T0, y, sunctx);

  retval = ARKodeSetOrder(arkode_mem, order);
  if (check_retval(&retval, "ARKodeSetOrder", 1)) { return 1; }

  retval = ARKodeSetUserData(arkode_mem, &udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  retval = SPRKStepSetUseCompensatedSums(arkode_mem, use_compsums);
  if (check_retval(&retval, "SPRKStepSetUseCompensatedSums", 1)) { return 1; }

  retval = ARKodeSetFixedStep(arkode_mem, dt);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 2);
  if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

  /* Print out starting energy, momentum before integrating */
  sunrealtype tret = T0;
  sunrealtype tout = T0 + dTout;
  fprintf(stdout, "t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.6Lf\n",
          (long double)tret, (long double)ydata[0],
          (long double)Energy(y, dt, &udata), (long double)SUN_RCONST(0.0));

  /* Do integration */
  for (iout = 0; iout < num_output_times; iout++)
  {
    if (args.use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
    retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

    /* Compute the analytical solution */
    Solution(tret, y, solution, &udata);

    /* Compute L2 error */
    N_VLinearSum(SUN_RCONST(1.0), y, -SUN_RCONST(1.0), solution, solution);
    sunrealtype err = sqrt(N_VDotProd(solution, solution));

    /* Output current integration status */
    fprintf(stdout, "t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.16Le\n",
            (long double)tret, (long double)ydata[0],
            (long double)Energy(y, dt, &udata), (long double)err);

    /* Check that solution error is within tolerance */
    if (err > SUNMAX(dt / pow(10, order - 2), 1000 * SUN_UNIT_ROUNDOFF))
    {
      fprintf(stderr, "FAILURE: solution error is too high\n");
      return 1;
    }

    /* Check if the solve was successful, if so, update the time and continue */
    if (retval >= 0)
    {
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    {
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }

  fprintf(stdout, "\n");
  N_VDestroy(y);
  N_VDestroy(solution);
  ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  ARKodeFree(&arkode_mem);
  SUNContext_Free(&sunctx);

  return 0;
}